

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpeg.c
# Opt level: O2

boolean mj_jpeg_empty_output_buffer(j_compress_ptr cinfo)

{
  jpeg_destination_mgr *pjVar1;
  size_t sVar2;
  JOCTET *pJVar3;
  
  pjVar1 = cinfo->dest;
  pJVar3 = (JOCTET *)realloc(pjVar1[1].next_output_byte,pjVar1[1].free_in_buffer + 0x800);
  if (pJVar3 == (JOCTET *)0x0) {
    *(undefined8 *)&cinfo->err->msg_code = 0x38;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  pjVar1[1].next_output_byte = pJVar3;
  sVar2 = pjVar1[1].free_in_buffer;
  pjVar1[1].free_in_buffer = sVar2 + 0x800;
  pjVar1->next_output_byte = pJVar3 + sVar2;
  pjVar1->free_in_buffer = 0x800;
  return 1;
}

Assistant:

boolean mj_jpeg_empty_output_buffer(j_compress_ptr cinfo) {
    JOCTET *         ret;
    mj_jpeg_dest_ptr dest = (mj_jpeg_dest_ptr)cinfo->dest;

    ret = (JOCTET *)realloc(dest->buf, (dest->size + MJ_DESTBUFFER_CHUNKSIZE) * sizeof(JOCTET));
    if(ret == NULL) {
        ERREXIT1(cinfo, JERR_OUT_OF_MEMORY, 0);
    }
    dest->buf = ret;
    dest->size += MJ_DESTBUFFER_CHUNKSIZE;

    dest->pub.next_output_byte = dest->buf + (dest->size - MJ_DESTBUFFER_CHUNKSIZE);
    dest->pub.free_in_buffer = MJ_DESTBUFFER_CHUNKSIZE;

    return TRUE;
}